

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

bool __thiscall
QIconModeViewBase::doBatchedItemLayout(QIconModeViewBase *this,QListViewLayoutInfo *info,int max)

{
  int iVar1;
  QRect r;
  qsizetype qVar2;
  int in_EDX;
  QCommonListViewBase *in_RSI;
  QCommonListViewBase *in_RDI;
  long in_FS_OFFSET;
  int row;
  QListViewItem item;
  QSize size;
  QStyleOptionViewItem option;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  int local_138;
  QCommonListViewBase *pQVar3;
  QListViewLayoutInfo *in_stack_ffffffffffffff10;
  QIconModeViewBase *in_stack_ffffffffffffff18;
  undefined1 local_d8 [208];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = in_RSI->batchStartRow;
  pQVar3 = in_RDI;
  qVar2 = QList<QListViewItem>::size((QList<QListViewItem> *)&in_RDI[2].qq);
  if (qVar2 <= iVar1) {
    memset(local_d8,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x886940);
    QCommonListViewBase::initViewItemOption
              ((QCommonListViewBase *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (QStyleOptionViewItem *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
              );
    qVar2 = QList<QListViewItem>::size((QList<QListViewItem> *)&in_RDI[2].qq);
    for (local_138 = (int)qVar2; local_138 <= in_RSI->batchStartRow; local_138 = local_138 + 1) {
      QCommonListViewBase::modelIndex(in_RSI,in_EDX);
      QCommonListViewBase::itemSize
                (in_RDI,(QStyleOptionViewItem *)
                        CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (QModelIndex *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      in_stack_fffffffffffffeb4 = QSize::width((QSize *)0x8869dd);
      QSize::height((QSize *)0x8869eb);
      QRect::QRect((QRect *)in_RDI,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                   in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
      r._8_8_ = pQVar3;
      r._0_8_ = in_RSI;
      QListViewItem::QListViewItem((QListViewItem *)in_RDI,r,in_stack_fffffffffffffeb4);
      QList<QListViewItem>::append
                ((QList<QListViewItem> *)
                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (parameter_type)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    }
    doDynamicLayout(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    QStyleOptionViewItem::~QStyleOptionViewItem
              ((QStyleOptionViewItem *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_EDX < in_RDI->batchStartRow;
  }
  __stack_chk_fail();
}

Assistant:

bool QIconModeViewBase::doBatchedItemLayout(const QListViewLayoutInfo &info, int max)
{
    if (info.last >= items.size()) {
        //first we create the items
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        for (int row = items.size(); row <= info.last; ++row) {
            QSize size = itemSize(option, modelIndex(row));
            QListViewItem item(QRect(0, 0, size.width(), size.height()), row); // default pos
            items.append(item);
        }
        doDynamicLayout(info);
    }
    return (batchStartRow > max); // done
}